

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O1

void __thiscall capnp::compiler::BrandedDecl::BrandedDecl(BrandedDecl *this,BrandedDecl *other)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SegmentReader *pSVar7;
  CapTableReader *pCVar8;
  void *pvVar9;
  WirePointer *pWVar10;
  StructPointerCount SVar11;
  undefined2 uVar12;
  int iVar13;
  undefined4 uVar14;
  
  (this->body).tag = (other->body).tag;
  if ((other->body).tag == 1) {
    *(undefined8 *)((long)&(this->body).field_1 + 0x20) =
         *(undefined8 *)((long)&(other->body).field_1 + 0x20);
    uVar2 = *(undefined8 *)&(other->body).field_1;
    uVar3 = *(undefined8 *)((long)&(other->body).field_1 + 8);
    uVar4 = *(undefined8 *)((long)&(other->body).field_1 + 0x18);
    *(undefined8 *)((long)&(this->body).field_1 + 0x10) =
         *(undefined8 *)((long)&(other->body).field_1 + 0x10);
    *(undefined8 *)((long)&(this->body).field_1 + 0x18) = uVar4;
    *(undefined8 *)&(this->body).field_1 = uVar2;
    *(undefined8 *)((long)&(this->body).field_1 + 8) = uVar3;
    bVar1 = (other->body).field_1.space[0x28];
    (this->body).field_1.space[0x28] = bVar1;
    if (bVar1 == '\x01') {
      uVar2 = *(undefined8 *)((long)&(other->body).field_1 + 0x30);
      uVar3 = *(undefined8 *)((long)&(other->body).field_1 + 0x38);
      uVar4 = *(undefined8 *)((long)&(other->body).field_1 + 0x40);
      uVar5 = *(undefined8 *)((long)&(other->body).field_1 + 0x48);
      uVar6 = *(undefined8 *)((long)&(other->body).field_1 + 0x58);
      *(undefined8 *)((long)&(this->body).field_1 + 0x50) =
           *(undefined8 *)((long)&(other->body).field_1 + 0x50);
      *(undefined8 *)((long)&(this->body).field_1 + 0x58) = uVar6;
      *(undefined8 *)((long)&(this->body).field_1 + 0x40) = uVar4;
      *(undefined8 *)((long)&(this->body).field_1 + 0x48) = uVar5;
      *(undefined8 *)((long)&(this->body).field_1 + 0x30) = uVar2;
      *(undefined8 *)((long)&(this->body).field_1 + 0x38) = uVar3;
    }
    if ((other->body).field_1.space[0x28] == '\x01') {
      (other->body).field_1.space[0x28] = '\0';
    }
  }
  if ((other->body).tag == 2) {
    uVar2 = *(undefined8 *)((long)&(other->body).field_1 + 8);
    *(undefined8 *)&(this->body).field_1 = *(undefined8 *)&(other->body).field_1;
    *(undefined8 *)((long)&(this->body).field_1 + 8) = uVar2;
  }
  (this->brand).disposer = (other->brand).disposer;
  (this->brand).ptr = (other->brand).ptr;
  (other->brand).ptr = (BrandScope *)0x0;
  pSVar7 = (other->source)._reader.segment;
  pCVar8 = (other->source)._reader.capTable;
  pvVar9 = (other->source)._reader.data;
  pWVar10 = (other->source)._reader.pointers;
  SVar11 = (other->source)._reader.pointerCount;
  uVar12 = *(undefined2 *)&(other->source)._reader.field_0x26;
  iVar13 = (other->source)._reader.nestingLimit;
  uVar14 = *(undefined4 *)&(other->source)._reader.field_0x2c;
  (this->source)._reader.dataSize = (other->source)._reader.dataSize;
  (this->source)._reader.pointerCount = SVar11;
  *(undefined2 *)&(this->source)._reader.field_0x26 = uVar12;
  (this->source)._reader.nestingLimit = iVar13;
  *(undefined4 *)&(this->source)._reader.field_0x2c = uVar14;
  (this->source)._reader.data = pvVar9;
  (this->source)._reader.pointers = pWVar10;
  (this->source)._reader.segment = pSVar7;
  (this->source)._reader.capTable = pCVar8;
  return;
}

Assistant:

void moveFrom(OneOf& other) {
    // Initialize as a copy of `other`.  Expects that `this` starts out uninitialized, so the tag
    // is invalid.
    tag = other.tag;
    doAll(moveVariantFrom<Variants>(other)...);
  }